

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_sync.cpp
# Opt level: O1

void Help(char *argv0)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (argv0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13f360);
  }
  else {
    sVar1 = strlen(argv0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <host> <path>",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  E.g.,",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
  if (argv0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13f360);
  }
  else {
    sVar1 = strlen(argv0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," www.boost.org /LICENSE_1_0.txt",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
  if (argv0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13f360);
  }
  else {
    sVar1 = strlen(argv0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," www.google.com /",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void Help(const char* argv0) {
  std::cout << "Usage: " << argv0 << " <host> <path>" << std::endl;
  std::cout << "  E.g.," << std::endl;
  std::cout << "    " << argv0 << " www.boost.org /LICENSE_1_0.txt" << std::endl;
  std::cout << "    " << argv0 << " www.google.com /" << std::endl;
}